

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::FindAllConnections
          (cmGraphVizWriter *this,ConnectionsMap *connectionMap,cmLinkItem *rootItem,
          Connections *extendedCons)

{
  initializer_list<cmLinkItem> __l;
  cmLinkItem *local_d8;
  allocator<cmLinkItem> local_be;
  less<cmLinkItem> local_bd [13];
  cmLinkItem *local_b0;
  cmLinkItem local_a8;
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> visitedItems;
  Connections *extendedCons_local;
  cmLinkItem *rootItem_local;
  ConnectionsMap *connectionMap_local;
  cmGraphVizWriter *this_local;
  
  local_b0 = &local_a8;
  visitedItems._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)extendedCons;
  cmLinkItem::cmLinkItem(local_b0,rootItem);
  local_68 = &local_a8;
  local_60 = 1;
  std::allocator<cmLinkItem>::allocator(&local_be);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set
            ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_58,__l,
             local_bd,&local_be);
  std::allocator<cmLinkItem>::~allocator(&local_be);
  local_d8 = (cmLinkItem *)&local_68;
  do {
    local_d8 = local_d8 + -1;
    cmLinkItem::~cmLinkItem(local_d8);
  } while (local_d8 != &local_a8);
  FindAllConnections(this,connectionMap,rootItem,
                     (Connections *)visitedItems._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_58
                    );
  std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::~set
            ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_58);
  return;
}

Assistant:

void cmGraphVizWriter::FindAllConnections(const ConnectionsMap& connectionMap,
                                          const cmLinkItem& rootItem,
                                          Connections& extendedCons)
{
  std::set<cmLinkItem> visitedItems = { rootItem };
  this->FindAllConnections(connectionMap, rootItem, extendedCons,
                           visitedItems);
}